

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

AcosLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_acos(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x2df) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2df;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    AcosLayerParams::AcosLayerParams(this_00.acos_);
    (this->layer_).acos_ = (AcosLayerParams *)this_00;
  }
  return (AcosLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::AcosLayerParams* NeuralNetworkLayer::mutable_acos() {
  if (!has_acos()) {
    clear_layer();
    set_has_acos();
    layer_.acos_ = new ::CoreML::Specification::AcosLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.acos)
  return layer_.acos_;
}